

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::Buffer(Buffer *this,string *buf)

{
  char *buf_00;
  long lVar1;
  string *buf_local;
  Buffer *this_local;
  
  buf_00 = (char *)std::__cxx11::string::data();
  lVar1 = std::__cxx11::string::size();
  Buffer(this,buf_00,lVar1 + 1);
  return;
}

Assistant:

Buffer::Buffer(const std::string &buf) : Buffer(buf.data(), buf.size() + 1) {}